

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCMessages.cpp
# Opt level: O0

IPCDeserializer * __thiscall
gnilk::IPCResultSummary::GetDeserializerForObject(IPCResultSummary *this,uint8_t idObject)

{
  IPCTestResults *this_00;
  IPCAssertError *this_01;
  IPCResultSummary *local_40;
  IPCResultSummary *local_30;
  uint8_t idObject_local;
  IPCResultSummary *this_local;
  
  if (idObject == 0x80) {
    this_local = (IPCResultSummary *)&this->super_IPCDeserializer;
  }
  else if (idObject == 0x82) {
    this_00 = (IPCTestResults *)operator_new(0x60);
    memset(this_00,0,0x60);
    IPCTestResults::IPCTestResults(this_00);
    local_30 = (IPCResultSummary *)0x0;
    if (this_00 != (IPCTestResults *)0x0) {
      local_30 = (IPCResultSummary *)&this_00->super_IPCDeserializer;
    }
    this_local = local_30;
  }
  else if (idObject == 0x83) {
    this_01 = (IPCAssertError *)operator_new(0x30);
    memset(this_01,0,0x30);
    IPCAssertError::IPCAssertError(this_01);
    local_40 = (IPCResultSummary *)0x0;
    if (this_01 != (IPCAssertError *)0x0) {
      local_40 = (IPCResultSummary *)&this_01->super_IPCDeserializer;
    }
    this_local = local_40;
  }
  else {
    this_local = (IPCResultSummary *)0x0;
  }
  return (IPCDeserializer *)this_local;
}

Assistant:

IPCDeserializer *IPCResultSummary::GetDeserializerForObject(uint8_t idObject) {
    switch(idObject) {
        case kMsgType_ResultSummary :
            return this;
        case kMsgType_TestResults :
            return (new IPCTestResults());
        case kMsgType_AssertError :
            return new IPCAssertError();
    }
    return nullptr;
}